

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::
         do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  char cVar2;
  size_t sVar3;
  long lVar4;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar5;
  appender aVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  big_decimal_fp *pbVar11;
  char *pcVar12;
  int iVar13;
  uint uVar14;
  float_specs fVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 *puVar18;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  sign_t sign;
  char *significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_e6 [30];
  float_specs local_c8;
  undefined1 local_bc [8];
  int iStack_b4;
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char local_98;
  anon_class_72_9_d68ba176 local_90;
  ulong local_48;
  float_specs local_40;
  _Alloc_hider local_38;
  
  fVar1 = (float_specs)fp->significand;
  iVar7 = fp->significand_size;
  local_e6[1] = 0x30;
  uVar9 = (ulong)fspecs >> 0x28 & 0xff;
  local_e6._10_4_ = (undefined4)uVar9;
  pbVar11 = (big_decimal_fp *)(ulong)((iVar7 + 1) - (uint)(local_e6._10_4_ == 0));
  uVar16 = fspecs._4_4_;
  local_e6[0] = '.';
  fVar15 = fspecs;
  local_e6._6_4_ = iVar7;
  local_c8 = fVar1;
  local_38._M_p = (pointer)fspecs;
  if ((uVar16 >> 0x11 & 1) != 0) {
    local_e6._14_8_ = fp;
    local_e6._22_8_ = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    local_48 = uVar9;
    local_40 = fspecs;
    local_e6[0] = decimal_point_impl<char>(loc);
    uVar9 = local_48;
    fp = (big_decimal_fp *)local_e6._14_8_;
    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_e6._22_8_;
    fVar15 = local_40;
  }
  uVar14 = fp->exponent;
  local_bc._0_4_ = iVar7 + uVar14;
  iVar13 = fVar15.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0011df3a:
    iVar8 = iVar7 + uVar14 + -1;
    if ((uVar16 >> 0x14 & 1) == 0) {
      uVar17 = 0;
      if (iVar7 == 1) {
        local_e6[0] = '\0';
        uVar17 = 0;
      }
    }
    else {
      uVar17 = 0;
      if (0 < iVar13 - iVar7) {
        uVar17 = (ulong)(uint)(iVar13 - iVar7);
      }
      pbVar11 = (big_decimal_fp *)((long)&pbVar11->significand + uVar17);
    }
    local_90.sign = (sign_t *)CONCAT44(local_90.sign._4_4_,(int)uVar9);
    local_90.significand_size._0_5_ = CONCAT14(local_e6[0],iVar7);
    local_90.fp._0_5_ = CONCAT14(0x30,(int)uVar17);
    local_90.fp = (big_decimal_fp *)
                  (CONCAT26(local_90.fp._6_2_,
                            CONCAT15(((uVar16 >> 0x10 & 1) == 0) << 5,local_90.fp._0_5_)) |
                  0x450000000000);
    local_90.grouping = (digit_grouping<char> *)CONCAT44(local_90.grouping._4_4_,iVar8);
    local_90.significand = (char **)fVar1;
    if (0 < specs->width) {
      if ((int)local_bc._0_4_ < 1) {
        iVar8 = 1 - local_bc._0_4_;
      }
      lVar4 = 2;
      if (99 < iVar8) {
        lVar4 = (ulong)(999 < iVar8) + 3;
      }
      puVar18 = (undefined1 *)((long)pbVar11 + lVar4 + (3 - (ulong)(local_e6[0] == '\0')));
      aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                        (out,specs,(size_t)puVar18,(size_t)puVar18,
                         (anon_class_40_8_dbbf3351 *)&local_90);
      return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
    cVar2 = local_e6[0];
    iVar13 = (int)uVar17;
    if ((int)uVar9 != 0) {
      cVar2 = ""[uVar9];
      sVar3 = ((buffer<char> *)
              out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->size_;
      uVar9 = sVar3 + 1;
      if (((buffer<char> *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
          ->capacity_ < uVar9) {
        (**((buffer<char> *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
           )->_vptr_buffer)();
        sVar3 = ((buffer<char> *)
                out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->size_;
        uVar9 = sVar3 + 1;
      }
      ((buffer<char> *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->
      size_ = uVar9;
      ((buffer<char> *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->
      ptr_[sVar3] = cVar2;
      cVar2 = local_90.significand_size._4_1_;
      iVar7 = (int)local_90.significand_size;
      iVar13 = (int)local_90.fp;
    }
    bVar5.container =
         (buffer<char> *)
         write_significand<fmt::v8::appender,char>(out,(char *)local_90.significand,iVar7,1,cVar2);
    if (0 < iVar13) {
      bVar5.container =
           (buffer<char> *)
           fill_n<fmt::v8::appender,int,char>
                     ((appender)bVar5.container,iVar13,(char *)((long)&local_90.fp + 4));
    }
    cVar2 = local_90.fp._5_1_;
    sVar3 = (bVar5.container)->size_;
    uVar9 = sVar3 + 1;
    if ((bVar5.container)->capacity_ < uVar9) {
      (**(bVar5.container)->_vptr_buffer)(bVar5.container);
      sVar3 = (bVar5.container)->size_;
      uVar9 = sVar3 + 1;
    }
    (bVar5.container)->size_ = uVar9;
    (bVar5.container)->ptr_[sVar3] = cVar2;
    aVar6 = write_exponent<char,fmt::v8::appender>((int)local_90.grouping,(appender)bVar5.container)
    ;
    return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar8 = 0x10;
    if (0 < iVar13) {
      iVar8 = iVar13;
    }
    if (((int)local_bc._0_4_ < -3) || (iVar8 < (int)local_bc._0_4_)) goto LAB_0011df3a;
  }
  if ((int)uVar14 < 0) {
    if ((int)local_bc._0_4_ < 1) {
      iVar8 = -local_bc._0_4_;
      local_bc._4_4_ = iVar8;
      if (SBORROW4(iVar13,iVar8) != iVar13 + local_bc._0_4_ < 0) {
        local_bc._4_4_ = iVar13;
      }
      if (iVar13 < 0) {
        local_bc._4_4_ = iVar8;
      }
      if (iVar7 != 0) {
        local_bc._4_4_ = iVar8;
      }
      if (iVar7 == 0 && local_bc._4_4_ == 0) {
        local_e6[2] = (char)((uVar16 & 0x100000) >> 0x14);
        iVar7 = 1;
        if (((ulong)fspecs & 0x10000000000000) == 0) goto LAB_0011e32b;
      }
      else {
        local_e6[2] = 1;
      }
      iVar7 = 2;
LAB_0011e32b:
      puVar18 = (undefined1 *)((long)&pbVar11->significand + (ulong)(uint)(iVar7 + local_bc._4_4_));
      local_90.sign = (sign_t *)(local_e6 + 10);
      local_90.significand = (char **)(local_e6 + 1);
      local_90.significand_size = (int *)(local_e6 + 2);
      local_90.fp = (big_decimal_fp *)local_e6;
      local_90.grouping = (digit_grouping<char> *)(local_bc + 4);
      local_90.fspecs = &local_c8;
      local_90.decimal_point = local_e6 + 6;
      aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_&>
                        (out,specs,(size_t)puVar18,(size_t)puVar18,
                         (anon_class_56_7_162c6e41 *)&local_90);
      return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
    iVar8 = 0;
    local_e6._2_4_ = iVar13 - iVar7 & (int)(uVar16 << 0xb) >> 0x1f;
    uVar14 = local_e6._2_4_;
    if ((int)local_e6._2_4_ < 1) {
      uVar14 = 0;
    }
    local_e6._14_8_ = pbVar11;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)(local_bc + 4),loc,(bool)((byte)(uVar16 >> 0x11) & 1));
    if (local_98 != '\0') {
      pcVar10 = (char *)CONCAT44(iStack_b4,local_bc._4_4_);
      pcVar12 = pcVar10 + local_b0;
      lVar4 = 0;
      do {
        if (pcVar10 == pcVar12) {
          cVar2 = pcVar12[-1];
          pcVar10 = pcVar12;
        }
        else {
          cVar2 = *pcVar10;
          if ((byte)(cVar2 + 0x81U) < 0x82) goto LAB_0011e284;
          pcVar10 = pcVar10 + 1;
        }
        iVar8 = iVar8 + cVar2;
        if ((int)local_e6._6_4_ <= iVar8) goto LAB_0011e284;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    lVar4 = 0;
LAB_0011e284:
    puVar18 = (undefined1 *)((long)(char **)local_e6._14_8_ + lVar4 + (ulong)uVar14 + 1);
    local_90.sign = (sign_t *)(local_e6 + 10);
    local_90.significand = (char **)&local_c8;
    local_90.significand_size = (int *)(local_e6 + 6);
    local_90.fp = (big_decimal_fp *)local_bc;
    local_90.grouping = (digit_grouping<char> *)local_e6;
    local_90.decimal_point = local_e6 + 2;
    local_90.num_zeros = (int *)(local_e6 + 1);
    local_90.fspecs = (float_specs *)(local_bc + 4);
    bVar5.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_&>
                   (out,specs,(size_t)puVar18,(size_t)puVar18,(anon_class_64_8_e6ffa566 *)&local_90)
    ;
    goto LAB_0011e2e7;
  }
  puVar18 = (undefined1 *)((long)&pbVar11->significand + (ulong)uVar14);
  local_e6._2_4_ = iVar13 - local_bc._0_4_;
  if ((uVar16 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_e6._2_4_) {
      if ((int)local_e6._2_4_ < 1) goto LAB_0011e185;
    }
    else {
      local_e6._2_4_ = 1;
    }
    puVar18 = puVar18 + (ulong)(uint)local_e6._2_4_ + 1;
  }
LAB_0011e185:
  local_e6._22_8_ = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  digit_grouping<char>::digit_grouping
            ((digit_grouping<char> *)(local_bc + 4),loc,(bool)((byte)(uVar16 >> 0x11) & 1));
  iVar7 = 0;
  if (local_98 != '\0') {
    pcVar10 = (char *)CONCAT44(iStack_b4,local_bc._4_4_);
    pcVar12 = pcVar10 + local_b0;
    lVar4 = 0;
    do {
      if (pcVar10 == pcVar12) {
        cVar2 = pcVar12[-1];
        pcVar10 = pcVar12;
      }
      else {
        cVar2 = *pcVar10;
        if ((byte)(cVar2 + 0x81U) < 0x82) goto LAB_0011e1eb;
        pcVar10 = pcVar10 + 1;
      }
      iVar7 = iVar7 + cVar2;
      if ((int)local_e6._6_4_ <= iVar7) goto LAB_0011e1eb;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  lVar4 = 0;
LAB_0011e1eb:
  local_90.sign = (sign_t *)(local_e6 + 10);
  local_90.significand = (char **)&local_c8;
  local_90.significand_size = (int *)(local_e6 + 6);
  local_90.fspecs = (float_specs *)&local_38;
  local_90.decimal_point = local_e6;
  local_90.num_zeros = (int *)(local_e6 + 2);
  local_90.zero = local_e6 + 1;
  local_90.fp = fp;
  local_90.grouping = (digit_grouping<char> *)(local_bc + 4);
  bVar5.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_&>
                 ((appender)local_e6._22_8_,specs,(size_t)(puVar18 + lVar4),
                  (size_t)(puVar18 + lVar4),&local_90);
LAB_0011e2e7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iStack_b4,local_bc._4_4_) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(iStack_b4,local_bc._4_4_),local_a8._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}